

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple16.h
# Opt level: O3

bool FastPForLib::Simple16<false>::tryme<7u,1u,7u,2u,7u,1u>(uint32_t *n,size_t len)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar3 = 7;
  if (len < 7) {
    uVar3 = len;
  }
  if (len == 0) {
    uVar1 = -uVar3;
    uVar2 = uVar3;
    uVar5 = uVar1;
  }
  else {
    uVar1 = 0;
    do {
      if (1 < n[uVar1]) {
        return false;
      }
      uVar1 = uVar1 + 1;
    } while (uVar3 != uVar1);
    uVar1 = len - uVar3;
    uVar5 = 7;
    if (uVar1 < 7) {
      uVar5 = uVar1;
    }
    uVar2 = (ulong)(uint)((int)uVar5 + (int)uVar3);
    if (7 < len) {
      do {
        if (3 < n[uVar3]) {
          return false;
        }
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
    }
  }
  bVar6 = true;
  if (7 < uVar1) {
    iVar4 = 7;
    if (uVar1 - uVar5 < 7) {
      iVar4 = (int)(uVar1 - uVar5);
    }
    uVar3 = uVar2 & 0xffffffff;
    do {
      uVar1 = uVar3 + 1;
      bVar6 = n[uVar3] < 2;
      if (!bVar6) {
        return bVar6;
      }
      uVar3 = uVar1;
    } while (uVar1 < (uint)(iVar4 + (int)uVar2));
  }
  return bVar6;
}

Assistant:

static bool tryme(const uint32_t *n, size_t len) {
    const uint32_t min1 = (len < num1) ? static_cast<uint32_t>(len) : num1;
    for (uint32_t i = 0; i < min1; i++) {
      if ((n[i]) >= (1U << log1))
        return false;
    }
    len -= min1;
    const uint32_t min2 = (len < num2) ? static_cast<uint32_t>(len) : num2;

    for (uint32_t i = min1; i < min1 + min2; i++) {
      if ((n[i]) >= (1U << log2))
        return false;
    }
    len -= min2;
    const uint32_t min3 = static_cast<uint32_t>((len < num3) ? len : num3);
    for (uint32_t i = min1 + min2; i < min1 + min2 + min3; i++) {
      if ((n[i]) >= (1U << log3))
        return false;
    }
    return true;
  }